

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderAlgorithmTests.cpp
# Opt level: O1

ShaderAlgorithmCase *
deqp::gles2::Functional::createExpressionCase
          (Context *context,char *caseName,char *description,bool isVertexCase,
          ShaderEvalFunc evalFunc,LineStream *shaderBody)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  ShaderAlgorithmCase *this;
  ostringstream *poVar3;
  long lVar4;
  char *pcVar5;
  allocator<char> local_409;
  string vertexShaderSource;
  string fragmentShaderSource;
  StringTemplate fragTemplate;
  StringTemplate vertTemplate;
  _Alloc_hider local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  ostringstream vtx;
  ostringstream frag;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
  poVar3 = (ostringstream *)&frag;
  if (isVertexCase) {
    poVar3 = (ostringstream *)&vtx;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&vtx,"attribute highp vec4 a_position;\n",0x21);
  std::__ostream_insert<char,std::char_traits<char>>
            (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
             "attribute highp vec4 a_unitCoords;\n",0x23);
  if (isVertexCase) {
    lVar4 = 0x1e;
    pcVar5 = "varying mediump vec3 v_color;\n";
    std::__ostream_insert<char,std::char_traits<char>>
              (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
               "varying mediump vec3 v_color;\n",0x1e);
  }
  else {
    lVar4 = 0x1f;
    pcVar5 = "varying mediump vec4 v_coords;\n";
    std::__ostream_insert<char,std::char_traits<char>>
              (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
               "varying mediump vec4 v_coords;\n",0x1f);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar5,lVar4);
  std::__ostream_insert<char,std::char_traits<char>>
            (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\tgl_Position = a_position;\n"
             ,0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
  pcVar5 = "\t${PRECISION} vec4 coords = v_coords;\n";
  if (isVertexCase) {
    pcVar5 = "\t${PRECISION} vec4 coords = a_unitCoords;\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar3,pcVar5,(ulong)isVertexCase * 4 + 0x26);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar3,"\t${PRECISION} vec3 res = vec3(0.0);\n",0x24);
  pcVar5 = deqp::gls::LineStream::str(shaderBody);
  if (pcVar5 == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar2 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,pcVar5,sVar2);
  }
  if (isVertexCase) {
    std::__ostream_insert<char,std::char_traits<char>>
              (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\tv_color = res;\n",0x10);
    lVar4 = 0x24;
    pcVar5 = "\tgl_FragColor = vec4(v_color, 1.0);\n";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
               "\tv_coords = a_unitCoords;\n",0x1a);
    lVar4 = 0x20;
    pcVar5 = "\tgl_FragColor = vec4(res, 1.0);\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar5,lVar4);
  std::__ostream_insert<char,std::char_traits<char>>
            (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &params._M_t._M_impl.super__Rb_tree_header._M_header;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&vertTemplate,(char (*) [10])0x1cf2bdb,(char (*) [8])0x1c00dfd);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&params,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&vertTemplate);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_p != &local_360) {
    operator_delete(local_370._M_p,local_360._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
    operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                    vertTemplate.m_template.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fragTemplate,vertexShaderSource._M_dataplus._M_p,
             (allocator<char> *)&fragmentShaderSource);
  tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
    operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                    fragTemplate.m_template.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &vertexShaderSource.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vertexShaderSource._M_dataplus._M_p != paVar1) {
    operator_delete(vertexShaderSource._M_dataplus._M_p,
                    vertexShaderSource.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vertexShaderSource,fragmentShaderSource._M_dataplus._M_p,&local_409);
  tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vertexShaderSource._M_dataplus._M_p != paVar1) {
    operator_delete(vertexShaderSource._M_dataplus._M_p,
                    vertexShaderSource.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fragmentShaderSource._M_dataplus._M_p != &fragmentShaderSource.field_2) {
    operator_delete(fragmentShaderSource._M_dataplus._M_p,
                    fragmentShaderSource.field_2._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
  tcu::StringTemplate::specialize(&fragmentShaderSource,&fragTemplate,&params);
  this = (ShaderAlgorithmCase *)operator_new(0x128);
  ShaderAlgorithmCase::ShaderAlgorithmCase
            (this,context,caseName,description,isVertexCase,evalFunc,
             vertexShaderSource._M_dataplus._M_p,fragmentShaderSource._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fragmentShaderSource._M_dataplus._M_p != &fragmentShaderSource.field_2) {
    operator_delete(fragmentShaderSource._M_dataplus._M_p,
                    fragmentShaderSource.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vertexShaderSource._M_dataplus._M_p != paVar1) {
    operator_delete(vertexShaderSource._M_dataplus._M_p,
                    vertexShaderSource.field_2._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::~StringTemplate(&fragTemplate);
  tcu::StringTemplate::~StringTemplate(&vertTemplate);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&params._M_t);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
  std::ios_base::~ios_base
            ((ios_base *)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
  std::ios_base::~ios_base
            ((ios_base *)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  return this;
}

Assistant:

static ShaderAlgorithmCase* createExpressionCase (Context& context, const char* caseName, const char* description, bool isVertexCase, ShaderEvalFunc evalFunc, LineStream& shaderBody)
{
	std::ostringstream vtx;
	std::ostringstream frag;
	std::ostringstream& op = isVertexCase ? vtx : frag;

	vtx << "attribute highp vec4 a_position;\n";
	vtx << "attribute highp vec4 a_unitCoords;\n";

	if (isVertexCase)
	{
		vtx << "varying mediump vec3 v_color;\n";
		frag << "varying mediump vec3 v_color;\n";
	}
	else
	{
		vtx << "varying mediump vec4 v_coords;\n";
		frag << "varying mediump vec4 v_coords;\n";
	}

//	op << "uniform mediump sampler2D ut_brick;\n";

	vtx << "\n";
	vtx << "void main()\n";
	vtx << "{\n";
	vtx << "	gl_Position = a_position;\n";

	frag << "\n";
	frag << "void main()\n";
	frag << "{\n";

	// Write matrix.
	if (isVertexCase)
		op << "	${PRECISION} vec4 coords = a_unitCoords;\n";
	else
		op << "	${PRECISION} vec4 coords = v_coords;\n";

	op << "	${PRECISION} vec3 res = vec3(0.0);\n";
	op << shaderBody.str();

	if (isVertexCase)
	{
		vtx << "	v_color = res;\n";
		frag << "	gl_FragColor = vec4(v_color, 1.0);\n";
	}
	else
	{
		vtx << "	v_coords = a_unitCoords;\n";
		frag << "	gl_FragColor = vec4(res, 1.0);\n";
	}

	vtx << "}\n";
	frag << "}\n";

	// Fill in shader templates.
	map<string, string> params;
	params.insert(pair<string, string>("PRECISION", "mediump"));

	StringTemplate vertTemplate(vtx.str().c_str());
	StringTemplate fragTemplate(frag.str().c_str());
	string vertexShaderSource = vertTemplate.specialize(params);
	string fragmentShaderSource = fragTemplate.specialize(params);

	return new ShaderAlgorithmCase(context, caseName, description, isVertexCase, evalFunc, vertexShaderSource.c_str(), fragmentShaderSource.c_str());
}